

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.h
# Opt level: O0

string * __thiscall
llvm::formatv_object_base::str_abi_cxx11_(string *__return_storage_ptr__,formatv_object_base *this)

{
  undefined1 local_50 [8];
  raw_string_ostream Stream;
  formatv_object_base *this_local;
  string *Result;
  
  Stream.OS._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  raw_string_ostream::raw_string_ostream((raw_string_ostream *)local_50,__return_storage_ptr__);
  raw_ostream::operator<<((raw_ostream *)local_50,this);
  raw_ostream::flush((raw_ostream *)local_50);
  Stream.OS._7_1_ = 1;
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_50);
  if ((Stream.OS._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str() const {
    std::string Result;
    raw_string_ostream Stream(Result);
    Stream << *this;
    Stream.flush();
    return Result;
  }